

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_lws_status.c
# Opt level: O1

void trigger_resend(per_vhost_data__lws_status *vhd)

{
  per_session_data__lws_status *ppVar1;
  
  for (ppVar1 = vhd->live_pss_list; ppVar1 != (per_session_data__lws_status *)0x0;
      ppVar1 = ppVar1->next) {
    if (ppVar1->walk == WALK_NONE) {
      ppVar1->field_0x128 = ppVar1->field_0x128 & 0xfe;
      ppVar1->walk_next = vhd->live_pss_list;
      ppVar1->walk = WALK_INITIAL;
    }
    else {
      ppVar1->field_0x128 = ppVar1->field_0x128 | 2;
    }
  }
  lws_callback_on_writable_all_protocol(vhd->context,vhd->protocol);
  return;
}

Assistant:

static void
trigger_resend(struct per_vhost_data__lws_status *vhd)
{
	lws_start_foreach_ll(struct per_session_data__lws_status *, pss,
			     vhd->live_pss_list) {
		if (pss->walk == WALK_NONE) {
			pss->subsequent = 0;
			pss->walk_next = vhd->live_pss_list;
			pss->walk = WALK_INITIAL;
		} else
			pss->changed_partway = 1;
	} lws_end_foreach_ll(pss, next);

	lws_callback_on_writable_all_protocol(vhd->context, vhd->protocol);
}